

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fixed-dtoa.cc
# Opt level: O0

void TestFastFixedDtoaGayFixed(void)

{
  int iVar1;
  PrecomputedFixed *pPVar2;
  Vector<const_double_conversion::PrecomputedFixed> VVar3;
  int number_digits;
  double v;
  PrecomputedFixed current_test;
  int i;
  Vector<const_double_conversion::PrecomputedFixed> precomputed;
  int point;
  int length;
  bool status;
  Vector<char> buffer;
  char buffer_container [500];
  undefined4 in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd6c;
  char *in_stack_fffffffffffffd70;
  char *value_source;
  undefined4 in_stack_fffffffffffffd78;
  int line;
  char *file;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 local_258;
  int local_23c;
  Vector<const_double_conversion::PrecomputedFixed> local_228;
  undefined1 local_209;
  Vector<char> local_208;
  char local_1f8 [72];
  int *in_stack_fffffffffffffe50;
  int *in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe64;
  double in_stack_fffffffffffffe68;
  Vector<char> in_stack_fffffffffffffe70;
  
  double_conversion::Vector<char>::Vector(&local_208,local_1f8,500);
  VVar3 = double_conversion::PrecomputedFixedRepresentations();
  local_228.start_ = VVar3.start_;
  local_228.length_ = VVar3.length_;
  local_23c = 0;
  while( true ) {
    line = local_23c;
    iVar1 = double_conversion::Vector<const_double_conversion::PrecomputedFixed>::length(&local_228)
    ;
    if (iVar1 <= line) break;
    pPVar2 = double_conversion::Vector<const_double_conversion::PrecomputedFixed>::operator[]
                       (&local_228,local_23c);
    value_source = pPVar2->representation;
    local_258 = (undefined4)*(undefined8 *)&pPVar2->number_digits;
    file = local_208.start_;
    iVar1 = local_208._12_4_;
    local_209 = double_conversion::FastFixedDtoa
                          (in_stack_fffffffffffffe68,in_stack_fffffffffffffe64,
                           in_stack_fffffffffffffe70,in_stack_fffffffffffffe58,
                           in_stack_fffffffffffffe50);
    CheckHelper(file,line,in_stack_fffffffffffffd70,SUB41((uint)in_stack_fffffffffffffd6c >> 0x18,0)
               );
    CheckEqualsHelper((char *)CONCAT44(local_258,in_stack_fffffffffffffd90),iVar1,file,line,
                      in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
    CheckHelper(file,line,in_stack_fffffffffffffd70,SUB41((uint)in_stack_fffffffffffffd6c >> 0x18,0)
               );
    double_conversion::Vector<char>::start(&local_208);
    CheckEqualsHelper((char *)CONCAT44(local_258,in_stack_fffffffffffffd90),iVar1,file,
                      (char *)CONCAT44(line,in_stack_fffffffffffffd78),value_source,
                      (char *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    local_23c = local_23c + 1;
    in_stack_fffffffffffffd70 = value_source;
  }
  return;
}

Assistant:

TEST(FastFixedDtoaGayFixed) {
  char buffer_container[kBufferSize];
  Vector<char> buffer(buffer_container, kBufferSize);
  bool status;
  int length;
  int point;

  Vector<const PrecomputedFixed> precomputed =
      PrecomputedFixedRepresentations();
  for (int i = 0; i < precomputed.length(); ++i) {
    const PrecomputedFixed current_test = precomputed[i];
    double v = current_test.v;
    int number_digits = current_test.number_digits;
    status = FastFixedDtoa(v, number_digits,
                           buffer, &length, &point);
    CHECK(status);
    CHECK_EQ(current_test.decimal_point, point);
    CHECK(number_digits >= length - point);
    CHECK_EQ(current_test.representation, buffer.start());
  }
}